

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::ordered_insert<Map::Pair<long,int>>
               (Array<Map::Pair<long,_int>_> *data,size_t *size,Pair<long,_int> *entry)

{
  Pair<long,_int> *pPVar1;
  ulong pos;
  size_t index;
  
  pos = 0;
  if (*size != 0) {
    index = 0;
    do {
      pPVar1 = Array<Map::Pair<long,_int>_>::operator[](data,index);
      index = index + 1;
      if (pPVar1->key < entry->key) {
        pos = index & 0xffffffff;
      }
    } while (index < *size);
    pos = (ulong)(int)pos;
  }
  insert_item<Map::Pair<long,int>>(data,pos,size,entry);
  return;
}

Assistant:

void ordered_insert(b_array::Array<T>& data, size_t& size, const T& entry) {
    int pos = 0;
    for (size_t i = 0; i < size; i++) {
        if (entry > data[i]) {
            pos = i + 1;
        }
    }
    insert_item(data, pos, size, entry);
}